

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscr_storage_hash_table_based.cpp
# Opt level: O0

void __thiscall
so_5::impl::hash_table_subscr_storage::storage_t::destroy_all_subscriptions(storage_t *this)

{
  bool bVar1;
  reference o;
  abstract_message_box_t *paVar2;
  agent_t *paVar3;
  pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>
  *i;
  iterator __end3;
  iterator __begin3;
  map_t *__range3;
  value_type *previous;
  storage_t *this_local;
  
  __range3 = (map_t *)0x0;
  __end3 = std::
           map<so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>,_std::less<so_5::impl::hash_table_subscr_storage::key_t>,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>_>_>
           ::begin(&this->m_map);
  i = (pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>
       *)std::
         map<so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>,_std::less<so_5::impl::hash_table_subscr_storage::key_t>,_std::allocator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>_>_>
         ::end(&this->m_map);
  do {
    bVar1 = std::operator!=(&__end3,(_Self *)&i);
    if (!bVar1) {
      (*(this->super_subscription_storage_t)._vptr_subscription_storage_t[7])();
      return;
    }
    o = std::
        _Rb_tree_iterator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>_>
        ::operator*(&__end3);
    if (__range3 == (map_t *)0x0) {
LAB_0046b9d6:
      paVar2 = intrusive_ptr_t<so_5::abstract_message_box_t>::operator->(&o->second);
      paVar3 = subscription_storage_t::owner(&this->super_subscription_storage_t);
      (*paVar2->_vptr_abstract_message_box_t[4])(paVar2,&(o->first).m_msg_type,paVar3);
    }
    else {
      bVar1 = key_t::is_same_mbox_msg_pair((key_t *)__range3,&o->first);
      if (!bVar1) goto LAB_0046b9d6;
    }
    std::
    _Rb_tree_iterator<std::pair<const_so_5::impl::hash_table_subscr_storage::key_t,_so_5::intrusive_ptr_t<so_5::abstract_message_box_t>_>_>
    ::operator++(&__end3);
    __range3 = (map_t *)o;
  } while( true );
}

Assistant:

void
storage_t::destroy_all_subscriptions()
	{
		{
			const map_t::value_type * previous = nullptr;
			for( auto & i : m_map )
			{
				// Optimisation: for several consequtive keys with
				// the same (mbox, msg_type) pair it is necessary to
				// call unsubscribe_event_handlers only once.
				if( !previous ||
						!previous->first.is_same_mbox_msg_pair( i.first ) )
					i.second->unsubscribe_event_handlers(
						i.first.m_msg_type,
						owner() );

				previous = &i;
			}
		}

		drop_content();
	}